

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EbmlMaster.cpp
# Opt level: O2

bool __thiscall libebml::EbmlMaster::VerifyChecksum(EbmlMaster *this)

{
  pointer ppEVar1;
  int iVar2;
  undefined4 extraout_var;
  size_t Index;
  ulong uVar3;
  bool bVar4;
  MemIOCallback TmpBuf;
  EbmlCrc32 aChecksum;
  
  bVar4 = true;
  if (this->bChecksumUsed == true) {
    EbmlCrc32::EbmlCrc32(&aChecksum);
    iVar2 = (*(this->super_EbmlElement)._vptr_EbmlElement[9])(this);
    MemIOCallback::MemIOCallback(&TmpBuf,CONCAT44(extraout_var,iVar2) - 6);
    for (uVar3 = 0;
        ppEVar1 = (this->ElementList).
                  super__Vector_base<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>
                  ._M_impl.super__Vector_impl_data._M_start,
        uVar3 < (ulong)((long)(this->ElementList).
                              super__Vector_base<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)ppEVar1 >> 3);
        uVar3 = uVar3 + 1) {
      EbmlElement::Render(ppEVar1[uVar3],&TmpBuf.super_IOCallback,true,false,true);
    }
    EbmlCrc32::FillCRC32(&aChecksum,TmpBuf.dataBuffer,(uint32)TmpBuf.dataBufferTotalSize);
    bVar4 = aChecksum.m_crc_final == (this->Checksum).m_crc_final;
    MemIOCallback::~MemIOCallback(&TmpBuf);
    EbmlBinary::~EbmlBinary(&aChecksum.super_EbmlBinary);
  }
  return bVar4;
}

Assistant:

bool EbmlMaster::VerifyChecksum() const
{
  if (!bChecksumUsed)
    return true;

  EbmlCrc32 aChecksum;
  /// \todo remove the Checksum if it's in the list
  /// \todo find another way when not all default values are saved or (unknown from the reader !!!)
  MemIOCallback TmpBuf(GetSize() - 6);
  for (size_t Index = 0; Index < ElementList.size(); Index++) {
    (ElementList[Index])->Render(TmpBuf, true, false, true);
  }
  aChecksum.FillCRC32(TmpBuf.GetDataBuffer(), TmpBuf.GetDataBufferSize());
  return (aChecksum.GetCrc32() == Checksum.GetCrc32());
}